

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O1

char * __thiscall QMetaProperty::typeName(QMetaProperty *this)

{
  uint typeId;
  QMetaObject *pQVar1;
  uint *puVar2;
  QMetaTypeInterface *pQVar3;
  char *pcVar4;
  long in_FS_OFFSET;
  QMetaType local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = this->mobj;
  if (pQVar1 != (QMetaObject *)0x0) {
    puVar2 = (pQVar1->d).data;
    pQVar3 = (pQVar1->d).metaTypes
             [(ulong)((int)((ulong)((long)(this->data).d - (long)puVar2) >> 2) - puVar2[7]) / 5];
    if (pQVar3 != (QMetaTypeInterface *)0x0) {
      pcVar4 = pQVar3->name;
      goto LAB_00287b70;
    }
    typeId = (this->data).d[1];
    if ((int)typeId < 0) {
      puVar2 = (pQVar1->d).stringdata;
      pcVar4 = (char *)((ulong)puVar2[(int)(typeId * 2)] + (long)puVar2);
      goto LAB_00287b70;
    }
    QMetaType::QMetaType(&local_18,typeId);
    if (local_18.d_ptr != (QMetaTypeInterface *)0x0) {
      pcVar4 = (local_18.d_ptr)->name;
      goto LAB_00287b70;
    }
  }
  pcVar4 = (char *)0x0;
LAB_00287b70:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return pcVar4;
}

Assistant:

const char *QMetaProperty::typeName() const
{
    if (!mobj)
        return nullptr;
    // TODO: can the metatype be invalid for dynamic metaobjects?
    if (const auto mt = metaType(); mt.isValid())
        return mt.name();
    return typeNameFromTypeInfo(mobj, data.type()).constData();
}